

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  RTCRayQueryContext *pRVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 (*pauVar29) [16];
  int iVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  Scene *pSVar37;
  ulong uVar38;
  ulong uVar39;
  undefined4 uVar40;
  ulong unaff_R12;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar63;
  float fVar74;
  float fVar75;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [32];
  undefined1 auVar67 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar76;
  undefined1 auVar73 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  undefined1 auVar91 [32];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar114 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [64];
  float fVar137;
  float fVar138;
  undefined1 auVar136 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_153c;
  ulong local_1538;
  RTCFilterFunctionNArguments local_1530;
  undefined1 local_1500 [32];
  undefined1 (*local_14d8) [16];
  long local_14d0;
  ulong local_14c8;
  ulong local_14c0;
  ulong local_14b8;
  float local_14b0;
  float local_14ac;
  float local_14a8;
  undefined4 local_14a4;
  undefined4 local_14a0;
  undefined4 local_149c;
  uint local_1498;
  uint local_1494;
  uint local_1490;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1430 [16];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  float local_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar60;
  float fVar61;
  float fVar62;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      local_14d8 = (undefined1 (*) [16])local_f90;
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar48 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar52 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      auVar77 = vandps_avx((undefined1  [16])aVar2,auVar77);
      auVar83._8_4_ = 0x219392ef;
      auVar83._0_8_ = 0x219392ef219392ef;
      auVar83._12_4_ = 0x219392ef;
      auVar77 = vcmpps_avx(auVar77,auVar83,1);
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = &DAT_3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar83 = vdivps_avx(auVar84,(undefined1  [16])aVar2);
      auVar85._8_4_ = 0x5d5e0b6b;
      auVar85._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar85._12_4_ = 0x5d5e0b6b;
      auVar77 = vblendvps_avx(auVar83,auVar85,auVar77);
      auVar78._0_4_ = auVar77._0_4_ * 0.99999964;
      auVar78._4_4_ = auVar77._4_4_ * 0.99999964;
      auVar78._8_4_ = auVar77._8_4_ * 0.99999964;
      auVar78._12_4_ = auVar77._12_4_ * 0.99999964;
      auVar64._0_4_ = auVar77._0_4_ * 1.0000004;
      auVar64._4_4_ = auVar77._4_4_ * 1.0000004;
      auVar64._8_4_ = auVar77._8_4_ * 1.0000004;
      auVar64._12_4_ = auVar77._12_4_ * 1.0000004;
      uVar40 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1330._4_4_ = uVar40;
      local_1330._0_4_ = uVar40;
      local_1330._8_4_ = uVar40;
      local_1330._12_4_ = uVar40;
      auVar100 = ZEXT1664(local_1330);
      uVar40 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1340._4_4_ = uVar40;
      local_1340._0_4_ = uVar40;
      local_1340._8_4_ = uVar40;
      local_1340._12_4_ = uVar40;
      auVar106 = ZEXT1664(local_1340);
      uVar40 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_1350._4_4_ = uVar40;
      local_1350._0_4_ = uVar40;
      local_1350._8_4_ = uVar40;
      local_1350._12_4_ = uVar40;
      auVar112 = ZEXT1664(local_1350);
      auVar77 = vmovshdup_avx(auVar78);
      local_1370 = vshufps_avx(auVar78,auVar78,0x55);
      auVar126 = ZEXT1664(local_1370);
      auVar83 = vshufpd_avx(auVar78,auVar78,1);
      local_1380 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar128 = ZEXT1664(local_1380);
      local_13a0 = vshufps_avx(auVar64,auVar64,0x55);
      auVar139 = ZEXT1664(local_13a0);
      uVar34 = (ulong)(auVar78._0_4_ < 0.0) * 0x10;
      uVar38 = (ulong)(auVar77._0_4_ < 0.0) << 4 | 0x20;
      local_13b0 = vshufps_avx(auVar64,auVar64,0xaa);
      auVar141 = ZEXT1664(local_13b0);
      uVar39 = (ulong)(auVar83._0_4_ < 0.0) << 4 | 0x40;
      local_14b8 = uVar34 ^ 0x10;
      local_14c0 = uVar38 ^ 0x10;
      local_14c8 = uVar39 ^ 0x10;
      uVar40 = auVar48._0_4_;
      local_1430._4_4_ = uVar40;
      local_1430._0_4_ = uVar40;
      local_1430._8_4_ = uVar40;
      local_1430._12_4_ = uVar40;
      auVar92 = ZEXT1664(local_1430);
      uVar40 = auVar52._0_4_;
      auVar47 = ZEXT1664(CONCAT412(uVar40,CONCAT48(uVar40,CONCAT44(uVar40,uVar40))));
      local_1120._16_16_ = mm_lookupmask_ps._240_16_;
      local_1120._0_16_ = mm_lookupmask_ps._0_16_;
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = &DAT_3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      auVar68._16_4_ = 0x3f800000;
      auVar68._20_4_ = 0x3f800000;
      auVar68._24_4_ = 0x3f800000;
      auVar68._28_4_ = 0x3f800000;
      auVar45._8_4_ = 0xbf800000;
      auVar45._0_8_ = 0xbf800000bf800000;
      auVar45._12_4_ = 0xbf800000;
      auVar45._16_4_ = 0xbf800000;
      auVar45._20_4_ = 0xbf800000;
      auVar45._24_4_ = 0xbf800000;
      auVar45._28_4_ = 0xbf800000;
      local_1140 = vblendvps_avx(auVar68,auVar45,local_1120);
      local_1360 = auVar78._0_4_;
      fStack_135c = auVar78._0_4_;
      fStack_1358 = auVar78._0_4_;
      fStack_1354 = auVar78._0_4_;
      local_1390 = auVar64._0_4_;
      fStack_138c = auVar64._0_4_;
      fStack_1388 = auVar64._0_4_;
      fStack_1384 = auVar64._0_4_;
      fVar115 = auVar78._0_4_;
      fVar117 = auVar78._0_4_;
      fVar119 = auVar78._0_4_;
      fVar137 = auVar64._0_4_;
      fVar138 = auVar64._0_4_;
      fVar90 = auVar64._0_4_;
      do {
        do {
          do {
            if (local_14d8 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar29 = local_14d8 + -1;
            local_14d8 = local_14d8 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar29 + 8));
          uVar42 = *(ulong *)*local_14d8;
          do {
            if ((uVar42 & 8) == 0) {
              auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar34),auVar100._0_16_);
              auVar48._0_4_ = auVar78._0_4_ * auVar77._0_4_;
              auVar48._4_4_ = fVar115 * auVar77._4_4_;
              auVar48._8_4_ = fVar117 * auVar77._8_4_;
              auVar48._12_4_ = fVar119 * auVar77._12_4_;
              auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar38),auVar106._0_16_);
              auVar52._0_4_ = auVar126._0_4_ * auVar77._0_4_;
              auVar52._4_4_ = auVar126._4_4_ * auVar77._4_4_;
              auVar52._8_4_ = auVar126._8_4_ * auVar77._8_4_;
              auVar52._12_4_ = auVar126._12_4_ * auVar77._12_4_;
              auVar77 = vmaxps_avx(auVar48,auVar52);
              auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar39),auVar112._0_16_);
              auVar53._0_4_ = auVar128._0_4_ * auVar83._0_4_;
              auVar53._4_4_ = auVar128._4_4_ * auVar83._4_4_;
              auVar53._8_4_ = auVar128._8_4_ * auVar83._8_4_;
              auVar53._12_4_ = auVar128._12_4_ * auVar83._12_4_;
              auVar83 = vmaxps_avx(auVar53,auVar92._0_16_);
              local_1300 = vmaxps_avx(auVar77,auVar83);
              auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + local_14b8),
                                   auVar100._0_16_);
              auVar54._0_4_ = auVar64._0_4_ * auVar77._0_4_;
              auVar54._4_4_ = fVar137 * auVar77._4_4_;
              auVar54._8_4_ = fVar138 * auVar77._8_4_;
              auVar54._12_4_ = fVar90 * auVar77._12_4_;
              auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + local_14c0),
                                   auVar106._0_16_);
              auVar65._0_4_ = auVar139._0_4_ * auVar77._0_4_;
              auVar65._4_4_ = auVar139._4_4_ * auVar77._4_4_;
              auVar65._8_4_ = auVar139._8_4_ * auVar77._8_4_;
              auVar65._12_4_ = auVar139._12_4_ * auVar77._12_4_;
              auVar77 = vminps_avx(auVar54,auVar65);
              auVar83 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + local_14c8),
                                   auVar112._0_16_);
              auVar66._0_4_ = auVar141._0_4_ * auVar83._0_4_;
              auVar66._4_4_ = auVar141._4_4_ * auVar83._4_4_;
              auVar66._8_4_ = auVar141._8_4_ * auVar83._8_4_;
              auVar66._12_4_ = auVar141._12_4_ * auVar83._12_4_;
              auVar83 = vminps_avx(auVar66,auVar47._0_16_);
              auVar77 = vminps_avx(auVar77,auVar83);
              auVar77 = vcmpps_avx(local_1300,auVar77,2);
              uVar40 = vmovmskps_avx(auVar77);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar40);
            }
            if ((uVar42 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar30 = 4;
              }
              else {
                uVar41 = uVar42 & 0xfffffffffffffff0;
                lVar36 = 0;
                for (uVar42 = unaff_R12; (uVar42 & 1) == 0;
                    uVar42 = uVar42 >> 1 | 0x8000000000000000) {
                  lVar36 = lVar36 + 1;
                }
                iVar30 = 0;
                uVar35 = unaff_R12 - 1 & unaff_R12;
                uVar42 = *(ulong *)(uVar41 + lVar36 * 8);
                if (uVar35 != 0) {
                  uVar32 = *(uint *)(local_1300 + lVar36 * 4);
                  lVar36 = 0;
                  for (uVar14 = uVar35; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000
                      ) {
                    lVar36 = lVar36 + 1;
                  }
                  uVar35 = uVar35 - 1 & uVar35;
                  uVar14 = *(ulong *)(uVar41 + lVar36 * 8);
                  uVar31 = *(uint *)(local_1300 + lVar36 * 4);
                  if (uVar35 == 0) {
                    if (uVar32 < uVar31) {
                      *(ulong *)*local_14d8 = uVar14;
                      *(uint *)(*local_14d8 + 8) = uVar31;
                      local_14d8 = local_14d8 + 1;
                    }
                    else {
                      *(ulong *)*local_14d8 = uVar42;
                      *(uint *)(*local_14d8 + 8) = uVar32;
                      local_14d8 = local_14d8 + 1;
                      uVar42 = uVar14;
                    }
                  }
                  else {
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar42;
                    auVar77 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar32));
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = uVar14;
                    auVar83 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar31));
                    lVar36 = 0;
                    for (uVar42 = uVar35; (uVar42 & 1) == 0;
                        uVar42 = uVar42 >> 1 | 0x8000000000000000) {
                      lVar36 = lVar36 + 1;
                    }
                    uVar35 = uVar35 - 1 & uVar35;
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = *(ulong *)(uVar41 + lVar36 * 8);
                    auVar52 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_1300 + lVar36 * 4)));
                    auVar48 = vpcmpgtd_avx(auVar83,auVar77);
                    if (uVar35 == 0) {
                      auVar84 = vpshufd_avx(auVar48,0xaa);
                      auVar48 = vblendvps_avx(auVar83,auVar77,auVar84);
                      auVar77 = vblendvps_avx(auVar77,auVar83,auVar84);
                      auVar83 = vpcmpgtd_avx(auVar52,auVar48);
                      auVar84 = vpshufd_avx(auVar83,0xaa);
                      auVar83 = vblendvps_avx(auVar52,auVar48,auVar84);
                      auVar48 = vblendvps_avx(auVar48,auVar52,auVar84);
                      auVar52 = vpcmpgtd_avx(auVar48,auVar77);
                      auVar84 = vpshufd_avx(auVar52,0xaa);
                      auVar52 = vblendvps_avx(auVar48,auVar77,auVar84);
                      auVar77 = vblendvps_avx(auVar77,auVar48,auVar84);
                      *local_14d8 = auVar77;
                      local_14d8[1] = auVar52;
                      uVar42 = auVar83._0_8_;
                      local_14d8 = local_14d8 + 2;
                    }
                    else {
                      lVar36 = 0;
                      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                        lVar36 = lVar36 + 1;
                      }
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = *(ulong *)(uVar41 + lVar36 * 8);
                      auVar85 = vpunpcklqdq_avx(auVar86,ZEXT416(*(uint *)(local_1300 + lVar36 * 4)))
                      ;
                      auVar84 = vpshufd_avx(auVar48,0xaa);
                      auVar48 = vblendvps_avx(auVar83,auVar77,auVar84);
                      auVar77 = vblendvps_avx(auVar77,auVar83,auVar84);
                      auVar83 = vpcmpgtd_avx(auVar85,auVar52);
                      auVar84 = vpshufd_avx(auVar83,0xaa);
                      auVar83 = vblendvps_avx(auVar85,auVar52,auVar84);
                      auVar52 = vblendvps_avx(auVar52,auVar85,auVar84);
                      auVar84 = vpcmpgtd_avx(auVar52,auVar77);
                      auVar85 = vpshufd_avx(auVar84,0xaa);
                      auVar84 = vblendvps_avx(auVar52,auVar77,auVar85);
                      auVar77 = vblendvps_avx(auVar77,auVar52,auVar85);
                      auVar52 = vpcmpgtd_avx(auVar83,auVar48);
                      auVar85 = vpshufd_avx(auVar52,0xaa);
                      auVar52 = vblendvps_avx(auVar83,auVar48,auVar85);
                      auVar83 = vblendvps_avx(auVar48,auVar83,auVar85);
                      auVar48 = vpcmpgtd_avx(auVar84,auVar83);
                      auVar85 = vpshufd_avx(auVar48,0xaa);
                      auVar48 = vblendvps_avx(auVar84,auVar83,auVar85);
                      auVar83 = vblendvps_avx(auVar83,auVar84,auVar85);
                      *local_14d8 = auVar77;
                      local_14d8[1] = auVar83;
                      local_14d8[2] = auVar48;
                      auVar92 = ZEXT1664(local_1430);
                      uVar42 = auVar52._0_8_;
                      local_14d8 = local_14d8 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar30 = 6;
            }
          } while (iVar30 == 0);
        } while (iVar30 != 6);
        local_14d0 = (ulong)((uint)uVar42 & 0xf) - 8;
        if (local_14d0 != 0) {
          uVar42 = uVar42 & 0xfffffffffffffff0;
          lVar36 = 0;
          local_1538 = unaff_R12;
          do {
            lVar33 = lVar36 * 0x60;
            pSVar37 = context->scene;
            ppfVar3 = (pSVar37->vertices).items;
            pfVar4 = ppfVar3[*(uint *)(uVar42 + 0x40 + lVar33)];
            auVar56._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar42 + 0x20 + lVar33));
            auVar56._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar42 + lVar33));
            pfVar5 = ppfVar3[*(uint *)(uVar42 + 0x48 + lVar33)];
            auVar69._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 0x28 + lVar33));
            auVar69._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar42 + 8 + lVar33));
            pfVar6 = ppfVar3[*(uint *)(uVar42 + 0x44 + lVar33)];
            auVar87._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 0x24 + lVar33));
            auVar87._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar42 + 4 + lVar33));
            pfVar7 = ppfVar3[*(uint *)(uVar42 + 0x4c + lVar33)];
            auVar107._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0x2c + lVar33));
            auVar107._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar42 + 0xc + lVar33));
            lVar1 = uVar42 + 0x40 + lVar33;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            lVar1 = uVar42 + 0x50 + lVar33;
            local_1320 = *(undefined8 *)(lVar1 + 0x10);
            uStack_1318 = *(undefined8 *)(lVar1 + 0x18);
            auVar48 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar42 + 0x10 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x18 + lVar33)));
            auVar77 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar42 + 0x10 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x18 + lVar33)));
            auVar52 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x14 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x1c + lVar33)));
            auVar83 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x14 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x1c + lVar33)));
            auVar64 = vunpcklps_avx(auVar77,auVar83);
            auVar78 = vunpcklps_avx(auVar48,auVar52);
            auVar77 = vunpckhps_avx(auVar48,auVar52);
            auVar52 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar42 + 0x30 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x38 + lVar33)));
            auVar83 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar42 + 0x30 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar42 + 0x38 + lVar33)));
            auVar84 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x34 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x3c + lVar33)));
            auVar48 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar42 + 0x34 + lVar33)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar42 + 0x3c + lVar33)));
            auVar48 = vunpcklps_avx(auVar83,auVar48);
            auVar85 = vunpcklps_avx(auVar52,auVar84);
            auVar83 = vunpckhps_avx(auVar52,auVar84);
            uStack_1310 = local_1320;
            uStack_1308 = uStack_1318;
            auVar45 = vunpcklps_avx(auVar87,auVar107);
            auVar68 = vunpcklps_avx(auVar56,auVar69);
            auVar13 = vunpcklps_avx(auVar68,auVar45);
            auVar45 = vunpckhps_avx(auVar68,auVar45);
            auVar68 = vunpckhps_avx(auVar87,auVar107);
            auVar59 = vunpckhps_avx(auVar56,auVar69);
            auVar68 = vunpcklps_avx(auVar59,auVar68);
            auVar70._16_16_ = auVar78;
            auVar70._0_16_ = auVar78;
            auVar88._16_16_ = auVar77;
            auVar88._0_16_ = auVar77;
            auVar99._16_16_ = auVar64;
            auVar99._0_16_ = auVar64;
            auVar140._16_16_ = auVar85;
            auVar140._0_16_ = auVar85;
            auVar79._16_16_ = auVar83;
            auVar79._0_16_ = auVar83;
            uVar40 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar101._4_4_ = uVar40;
            auVar101._0_4_ = uVar40;
            auVar101._8_4_ = uVar40;
            auVar101._12_4_ = uVar40;
            auVar101._16_4_ = uVar40;
            auVar101._20_4_ = uVar40;
            auVar101._24_4_ = uVar40;
            auVar101._28_4_ = uVar40;
            uVar40 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar108._4_4_ = uVar40;
            auVar108._0_4_ = uVar40;
            auVar108._8_4_ = uVar40;
            auVar108._12_4_ = uVar40;
            auVar108._16_4_ = uVar40;
            auVar108._20_4_ = uVar40;
            auVar108._24_4_ = uVar40;
            auVar108._28_4_ = uVar40;
            auVar43._16_16_ = auVar48;
            auVar43._0_16_ = auVar48;
            uVar40 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar136._4_4_ = uVar40;
            auVar136._0_4_ = uVar40;
            auVar136._8_4_ = uVar40;
            auVar136._12_4_ = uVar40;
            auVar136._16_4_ = uVar40;
            auVar136._20_4_ = uVar40;
            auVar136._24_4_ = uVar40;
            auVar136._28_4_ = uVar40;
            local_13e0 = vsubps_avx(auVar13,auVar101);
            local_1400 = vsubps_avx(auVar45,auVar108);
            local_fe0 = vsubps_avx(auVar68,auVar136);
            auVar45 = vsubps_avx(auVar70,auVar101);
            auVar68 = vsubps_avx(auVar88,auVar108);
            auVar59 = vsubps_avx(auVar99,auVar136);
            auVar13 = vsubps_avx(auVar140,auVar101);
            auVar56 = vsubps_avx(auVar79,auVar108);
            auVar11 = vsubps_avx(auVar43,auVar136);
            local_1020 = vsubps_avx(auVar13,local_13e0);
            local_1420 = vsubps_avx(auVar56,local_1400);
            local_1000 = vsubps_avx(auVar11,local_fe0);
            auVar44._0_4_ = auVar13._0_4_ + local_13e0._0_4_;
            auVar44._4_4_ = auVar13._4_4_ + local_13e0._4_4_;
            auVar44._8_4_ = auVar13._8_4_ + local_13e0._8_4_;
            auVar44._12_4_ = auVar13._12_4_ + local_13e0._12_4_;
            auVar44._16_4_ = auVar13._16_4_ + local_13e0._16_4_;
            auVar44._20_4_ = auVar13._20_4_ + local_13e0._20_4_;
            auVar44._24_4_ = auVar13._24_4_ + local_13e0._24_4_;
            auVar44._28_4_ = auVar13._28_4_ + local_13e0._28_4_;
            auVar71._0_4_ = local_1400._0_4_ + auVar56._0_4_;
            auVar71._4_4_ = local_1400._4_4_ + auVar56._4_4_;
            auVar71._8_4_ = local_1400._8_4_ + auVar56._8_4_;
            auVar71._12_4_ = local_1400._12_4_ + auVar56._12_4_;
            auVar71._16_4_ = local_1400._16_4_ + auVar56._16_4_;
            auVar71._20_4_ = local_1400._20_4_ + auVar56._20_4_;
            auVar71._24_4_ = local_1400._24_4_ + auVar56._24_4_;
            auVar71._28_4_ = local_1400._28_4_ + auVar56._28_4_;
            auVar78._0_4_ = local_fe0._0_4_;
            auVar80._0_4_ = auVar11._0_4_ + auVar78._0_4_;
            fVar115 = local_fe0._4_4_;
            auVar80._4_4_ = auVar11._4_4_ + fVar115;
            fVar117 = local_fe0._8_4_;
            auVar80._8_4_ = auVar11._8_4_ + fVar117;
            fVar119 = local_fe0._12_4_;
            auVar80._12_4_ = auVar11._12_4_ + fVar119;
            auVar64._0_4_ = local_fe0._16_4_;
            auVar80._16_4_ = auVar11._16_4_ + auVar64._0_4_;
            fVar137 = local_fe0._20_4_;
            auVar80._20_4_ = auVar11._20_4_ + fVar137;
            fVar138 = local_fe0._24_4_;
            auVar80._24_4_ = auVar11._24_4_ + fVar138;
            fVar90 = local_fe0._28_4_;
            auVar80._28_4_ = auVar11._28_4_ + fVar90;
            auVar12._4_4_ = local_1000._4_4_ * auVar71._4_4_;
            auVar12._0_4_ = local_1000._0_4_ * auVar71._0_4_;
            auVar12._8_4_ = local_1000._8_4_ * auVar71._8_4_;
            auVar12._12_4_ = local_1000._12_4_ * auVar71._12_4_;
            auVar12._16_4_ = local_1000._16_4_ * auVar71._16_4_;
            auVar12._20_4_ = local_1000._20_4_ * auVar71._20_4_;
            auVar12._24_4_ = local_1000._24_4_ * auVar71._24_4_;
            auVar12._28_4_ = uVar40;
            auVar83 = vfmsub231ps_fma(auVar12,local_1420,auVar80);
            auVar15._4_4_ = local_1020._4_4_ * auVar80._4_4_;
            auVar15._0_4_ = local_1020._0_4_ * auVar80._0_4_;
            auVar15._8_4_ = local_1020._8_4_ * auVar80._8_4_;
            auVar15._12_4_ = local_1020._12_4_ * auVar80._12_4_;
            auVar15._16_4_ = local_1020._16_4_ * auVar80._16_4_;
            auVar15._20_4_ = local_1020._20_4_ * auVar80._20_4_;
            auVar15._24_4_ = local_1020._24_4_ * auVar80._24_4_;
            auVar15._28_4_ = auVar80._28_4_;
            auVar77 = vfmsub231ps_fma(auVar15,local_1000,auVar44);
            auVar16._4_4_ = local_1420._4_4_ * auVar44._4_4_;
            auVar16._0_4_ = local_1420._0_4_ * auVar44._0_4_;
            auVar16._8_4_ = local_1420._8_4_ * auVar44._8_4_;
            auVar16._12_4_ = local_1420._12_4_ * auVar44._12_4_;
            auVar16._16_4_ = local_1420._16_4_ * auVar44._16_4_;
            auVar16._20_4_ = local_1420._20_4_ * auVar44._20_4_;
            auVar16._24_4_ = local_1420._24_4_ * auVar44._24_4_;
            auVar16._28_4_ = auVar44._28_4_;
            auVar48 = vfmsub231ps_fma(auVar16,local_1020,auVar71);
            uVar40 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            local_1500._4_4_ = uVar40;
            local_1500._0_4_ = uVar40;
            local_1500._8_4_ = uVar40;
            local_1500._12_4_ = uVar40;
            local_1500._16_4_ = uVar40;
            local_1500._20_4_ = uVar40;
            local_1500._24_4_ = uVar40;
            local_1500._28_4_ = uVar40;
            local_1040 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar17._4_4_ = local_1040 * auVar48._4_4_;
            auVar17._0_4_ = local_1040 * auVar48._0_4_;
            auVar17._8_4_ = local_1040 * auVar48._8_4_;
            auVar17._12_4_ = local_1040 * auVar48._12_4_;
            auVar17._16_4_ = local_1040 * 0.0;
            auVar17._20_4_ = local_1040 * 0.0;
            auVar17._24_4_ = local_1040 * 0.0;
            auVar17._28_4_ = local_1020._28_4_;
            auVar77 = vfmadd231ps_fma(auVar17,local_1500,ZEXT1632(auVar77));
            uVar40 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            local_1480._4_4_ = uVar40;
            local_1480._0_4_ = uVar40;
            local_1480._8_4_ = uVar40;
            local_1480._12_4_ = uVar40;
            local_1480._16_4_ = uVar40;
            local_1480._20_4_ = uVar40;
            local_1480._24_4_ = uVar40;
            local_1480._28_4_ = uVar40;
            local_1300 = vfmadd231ps_fma(ZEXT1632(auVar77),local_1480,ZEXT1632(auVar83));
            local_1060 = vsubps_avx(local_1400,auVar68);
            local_1080 = vsubps_avx(local_fe0,auVar59);
            auVar72._0_4_ = local_1400._0_4_ + auVar68._0_4_;
            auVar72._4_4_ = local_1400._4_4_ + auVar68._4_4_;
            auVar72._8_4_ = local_1400._8_4_ + auVar68._8_4_;
            auVar72._12_4_ = local_1400._12_4_ + auVar68._12_4_;
            auVar72._16_4_ = local_1400._16_4_ + auVar68._16_4_;
            auVar72._20_4_ = local_1400._20_4_ + auVar68._20_4_;
            auVar72._24_4_ = local_1400._24_4_ + auVar68._24_4_;
            auVar72._28_4_ = local_1400._28_4_ + auVar68._28_4_;
            auVar81._0_4_ = auVar59._0_4_ + auVar78._0_4_;
            auVar81._4_4_ = auVar59._4_4_ + fVar115;
            auVar81._8_4_ = auVar59._8_4_ + fVar117;
            auVar81._12_4_ = auVar59._12_4_ + fVar119;
            auVar81._16_4_ = auVar59._16_4_ + auVar64._0_4_;
            auVar81._20_4_ = auVar59._20_4_ + fVar137;
            auVar81._24_4_ = auVar59._24_4_ + fVar138;
            fVar135 = auVar59._28_4_;
            auVar81._28_4_ = fVar135 + fVar90;
            fVar60 = local_1080._0_4_;
            fVar61 = local_1080._4_4_;
            auVar18._4_4_ = auVar72._4_4_ * fVar61;
            auVar18._0_4_ = auVar72._0_4_ * fVar60;
            fVar62 = local_1080._8_4_;
            auVar18._8_4_ = auVar72._8_4_ * fVar62;
            fVar63 = local_1080._12_4_;
            auVar18._12_4_ = auVar72._12_4_ * fVar63;
            fVar74 = local_1080._16_4_;
            auVar18._16_4_ = auVar72._16_4_ * fVar74;
            fVar75 = local_1080._20_4_;
            auVar18._20_4_ = auVar72._20_4_ * fVar75;
            fVar76 = local_1080._24_4_;
            auVar18._24_4_ = auVar72._24_4_ * fVar76;
            auVar18._28_4_ = fVar90;
            auVar83 = vfmsub231ps_fma(auVar18,local_1060,auVar81);
            local_10a0 = vsubps_avx(local_13e0,auVar45);
            fVar127 = local_10a0._0_4_;
            fVar129 = local_10a0._4_4_;
            auVar19._4_4_ = fVar129 * auVar81._4_4_;
            auVar19._0_4_ = fVar127 * auVar81._0_4_;
            fVar130 = local_10a0._8_4_;
            auVar19._8_4_ = fVar130 * auVar81._8_4_;
            fVar131 = local_10a0._12_4_;
            auVar19._12_4_ = fVar131 * auVar81._12_4_;
            fVar132 = local_10a0._16_4_;
            auVar19._16_4_ = fVar132 * auVar81._16_4_;
            fVar133 = local_10a0._20_4_;
            auVar19._20_4_ = fVar133 * auVar81._20_4_;
            fVar134 = local_10a0._24_4_;
            auVar19._24_4_ = fVar134 * auVar81._24_4_;
            auVar19._28_4_ = local_1000._28_4_;
            auVar82._0_4_ = auVar45._0_4_ + local_13e0._0_4_;
            auVar82._4_4_ = auVar45._4_4_ + local_13e0._4_4_;
            auVar82._8_4_ = auVar45._8_4_ + local_13e0._8_4_;
            auVar82._12_4_ = auVar45._12_4_ + local_13e0._12_4_;
            auVar82._16_4_ = auVar45._16_4_ + local_13e0._16_4_;
            auVar82._20_4_ = auVar45._20_4_ + local_13e0._20_4_;
            auVar82._24_4_ = auVar45._24_4_ + local_13e0._24_4_;
            auVar82._28_4_ = auVar45._28_4_ + local_13e0._28_4_;
            auVar77 = vfmsub231ps_fma(auVar19,local_1080,auVar82);
            fVar113 = local_1060._0_4_;
            fVar116 = local_1060._4_4_;
            auVar20._4_4_ = fVar116 * auVar82._4_4_;
            auVar20._0_4_ = fVar113 * auVar82._0_4_;
            fVar118 = local_1060._8_4_;
            auVar20._8_4_ = fVar118 * auVar82._8_4_;
            fVar120 = local_1060._12_4_;
            auVar20._12_4_ = fVar120 * auVar82._12_4_;
            fVar121 = local_1060._16_4_;
            auVar20._16_4_ = fVar121 * auVar82._16_4_;
            fVar122 = local_1060._20_4_;
            auVar20._20_4_ = fVar122 * auVar82._20_4_;
            fVar123 = local_1060._24_4_;
            auVar20._24_4_ = fVar123 * auVar82._24_4_;
            auVar20._28_4_ = auVar82._28_4_;
            auVar48 = vfmsub231ps_fma(auVar20,local_10a0,auVar72);
            auVar21._4_4_ = local_1040 * auVar48._4_4_;
            auVar21._0_4_ = local_1040 * auVar48._0_4_;
            auVar21._8_4_ = local_1040 * auVar48._8_4_;
            auVar21._12_4_ = local_1040 * auVar48._12_4_;
            auVar21._16_4_ = local_1040 * 0.0;
            auVar21._20_4_ = local_1040 * 0.0;
            auVar21._24_4_ = local_1040 * 0.0;
            auVar21._28_4_ = local_1080._28_4_;
            auVar77 = vfmadd231ps_fma(auVar21,local_1500,ZEXT1632(auVar77));
            auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),local_1480,ZEXT1632(auVar83));
            auVar12 = vsubps_avx(auVar45,auVar13);
            auVar57._0_4_ = auVar45._0_4_ + auVar13._0_4_;
            auVar57._4_4_ = auVar45._4_4_ + auVar13._4_4_;
            auVar57._8_4_ = auVar45._8_4_ + auVar13._8_4_;
            auVar57._12_4_ = auVar45._12_4_ + auVar13._12_4_;
            auVar57._16_4_ = auVar45._16_4_ + auVar13._16_4_;
            auVar57._20_4_ = auVar45._20_4_ + auVar13._20_4_;
            auVar57._24_4_ = auVar45._24_4_ + auVar13._24_4_;
            auVar57._28_4_ = auVar45._28_4_ + auVar13._28_4_;
            auVar13 = vsubps_avx(auVar68,auVar56);
            auVar89._0_4_ = auVar68._0_4_ + auVar56._0_4_;
            auVar89._4_4_ = auVar68._4_4_ + auVar56._4_4_;
            auVar89._8_4_ = auVar68._8_4_ + auVar56._8_4_;
            auVar89._12_4_ = auVar68._12_4_ + auVar56._12_4_;
            auVar89._16_4_ = auVar68._16_4_ + auVar56._16_4_;
            auVar89._20_4_ = auVar68._20_4_ + auVar56._20_4_;
            auVar89._24_4_ = auVar68._24_4_ + auVar56._24_4_;
            auVar89._28_4_ = auVar68._28_4_ + auVar56._28_4_;
            auVar56 = vsubps_avx(auVar59,auVar11);
            auVar50._0_4_ = auVar59._0_4_ + auVar11._0_4_;
            auVar50._4_4_ = auVar59._4_4_ + auVar11._4_4_;
            auVar50._8_4_ = auVar59._8_4_ + auVar11._8_4_;
            auVar50._12_4_ = auVar59._12_4_ + auVar11._12_4_;
            auVar50._16_4_ = auVar59._16_4_ + auVar11._16_4_;
            auVar50._20_4_ = auVar59._20_4_ + auVar11._20_4_;
            auVar50._24_4_ = auVar59._24_4_ + auVar11._24_4_;
            auVar50._28_4_ = fVar135 + auVar11._28_4_;
            auVar91._0_4_ = auVar56._0_4_ * auVar89._0_4_;
            auVar91._4_4_ = auVar56._4_4_ * auVar89._4_4_;
            auVar91._8_4_ = auVar56._8_4_ * auVar89._8_4_;
            auVar91._12_4_ = auVar56._12_4_ * auVar89._12_4_;
            auVar91._16_4_ = auVar56._16_4_ * auVar89._16_4_;
            auVar91._20_4_ = auVar56._20_4_ * auVar89._20_4_;
            auVar91._24_4_ = auVar56._24_4_ * auVar89._24_4_;
            auVar91._28_4_ = 0;
            auVar48 = vfmsub231ps_fma(auVar91,auVar13,auVar50);
            auVar59._4_4_ = auVar50._4_4_ * auVar12._4_4_;
            auVar59._0_4_ = auVar50._0_4_ * auVar12._0_4_;
            auVar59._8_4_ = auVar50._8_4_ * auVar12._8_4_;
            auVar59._12_4_ = auVar50._12_4_ * auVar12._12_4_;
            auVar59._16_4_ = auVar50._16_4_ * auVar12._16_4_;
            auVar59._20_4_ = auVar50._20_4_ * auVar12._20_4_;
            auVar59._24_4_ = auVar50._24_4_ * auVar12._24_4_;
            auVar59._28_4_ = auVar50._28_4_;
            auVar83 = vfmsub231ps_fma(auVar59,auVar56,auVar57);
            auVar11._4_4_ = auVar57._4_4_ * auVar13._4_4_;
            auVar11._0_4_ = auVar57._0_4_ * auVar13._0_4_;
            auVar11._8_4_ = auVar57._8_4_ * auVar13._8_4_;
            auVar11._12_4_ = auVar57._12_4_ * auVar13._12_4_;
            auVar11._16_4_ = auVar57._16_4_ * auVar13._16_4_;
            auVar11._20_4_ = auVar57._20_4_ * auVar13._20_4_;
            auVar11._24_4_ = auVar57._24_4_ * auVar13._24_4_;
            auVar11._28_4_ = auVar57._28_4_;
            auVar52 = vfmsub231ps_fma(auVar11,auVar12,auVar89);
            fStack_103c = local_1040;
            fStack_1038 = local_1040;
            fStack_1034 = local_1040;
            fStack_1030 = local_1040;
            fStack_102c = local_1040;
            fStack_1028 = local_1040;
            fStack_1024 = local_1040;
            auVar58._0_4_ = local_1040 * auVar52._0_4_;
            auVar58._4_4_ = local_1040 * auVar52._4_4_;
            auVar58._8_4_ = local_1040 * auVar52._8_4_;
            auVar58._12_4_ = local_1040 * auVar52._12_4_;
            auVar58._16_4_ = local_1040 * 0.0;
            auVar58._20_4_ = local_1040 * 0.0;
            auVar58._24_4_ = local_1040 * 0.0;
            auVar58._28_4_ = 0;
            auVar83 = vfmadd231ps_fma(auVar58,local_1500,ZEXT1632(auVar83));
            auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_1480,ZEXT1632(auVar48));
            local_12e0 = auVar77._0_4_;
            fStack_12dc = auVar77._4_4_;
            fStack_12d8 = auVar77._8_4_;
            fStack_12d4 = auVar77._12_4_;
            local_12c0 = ZEXT1632(CONCAT412(auVar83._12_4_ + local_1300._12_4_ + fStack_12d4,
                                            CONCAT48(auVar83._8_4_ + local_1300._8_4_ + fStack_12d8,
                                                     CONCAT44(auVar83._4_4_ +
                                                              local_1300._4_4_ + fStack_12dc,
                                                              auVar83._0_4_ +
                                                              local_1300._0_4_ + local_12e0))));
            auVar51._8_4_ = 0x7fffffff;
            auVar51._0_8_ = 0x7fffffff7fffffff;
            auVar51._12_4_ = 0x7fffffff;
            auVar51._16_4_ = 0x7fffffff;
            auVar51._20_4_ = 0x7fffffff;
            auVar51._24_4_ = 0x7fffffff;
            auVar51._28_4_ = 0x7fffffff;
            local_10e0 = ZEXT1632(local_1300);
            auVar45 = vminps_avx(local_10e0,ZEXT1632(auVar77));
            auVar45 = vminps_avx(auVar45,ZEXT1632(auVar83));
            local_1100 = vandps_avx(local_12c0,auVar51);
            fVar90 = local_1100._0_4_ * 1.1920929e-07;
            fVar93 = local_1100._4_4_ * 1.1920929e-07;
            auVar22._4_4_ = fVar93;
            auVar22._0_4_ = fVar90;
            fVar94 = local_1100._8_4_ * 1.1920929e-07;
            auVar22._8_4_ = fVar94;
            fVar95 = local_1100._12_4_ * 1.1920929e-07;
            auVar22._12_4_ = fVar95;
            fVar96 = local_1100._16_4_ * 1.1920929e-07;
            auVar22._16_4_ = fVar96;
            fVar97 = local_1100._20_4_ * 1.1920929e-07;
            auVar22._20_4_ = fVar97;
            fVar98 = local_1100._24_4_ * 1.1920929e-07;
            auVar22._24_4_ = fVar98;
            auVar22._28_4_ = 0x34000000;
            auVar102._0_8_ = CONCAT44(fVar93,fVar90) ^ 0x8000000080000000;
            auVar102._8_4_ = -fVar94;
            auVar102._12_4_ = -fVar95;
            auVar102._16_4_ = -fVar96;
            auVar102._20_4_ = -fVar97;
            auVar102._24_4_ = -fVar98;
            auVar102._28_4_ = 0xb4000000;
            auVar45 = vcmpps_avx(auVar45,auVar102,5);
            local_10c0 = ZEXT1632(auVar77);
            auVar68 = vmaxps_avx(local_10e0,ZEXT1632(auVar77));
            auVar68 = vmaxps_avx(auVar68,ZEXT1632(auVar83));
            auVar68 = vcmpps_avx(auVar68,auVar22,2);
            auVar68 = vorps_avx(auVar45,auVar68);
            if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0x7f,0) != '\0') ||
                  (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar68 >> 0xbf,0) != '\0') ||
                (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar68[0x1f] < '\0') {
              auVar23._4_4_ = fVar116 * local_1000._4_4_;
              auVar23._0_4_ = fVar113 * local_1000._0_4_;
              auVar23._8_4_ = fVar118 * local_1000._8_4_;
              auVar23._12_4_ = fVar120 * local_1000._12_4_;
              auVar23._16_4_ = fVar121 * local_1000._16_4_;
              auVar23._20_4_ = fVar122 * local_1000._20_4_;
              auVar23._24_4_ = fVar123 * local_1000._24_4_;
              auVar23._28_4_ = auVar45._28_4_;
              auVar24._4_4_ = fVar129 * local_1420._4_4_;
              auVar24._0_4_ = fVar127 * local_1420._0_4_;
              auVar24._8_4_ = fVar130 * local_1420._8_4_;
              auVar24._12_4_ = fVar131 * local_1420._12_4_;
              auVar24._16_4_ = fVar132 * local_1420._16_4_;
              auVar24._20_4_ = fVar133 * local_1420._20_4_;
              auVar24._24_4_ = fVar134 * local_1420._24_4_;
              auVar24._28_4_ = fVar135;
              auVar77 = vfmsub213ps_fma(local_1420,local_1080,auVar23);
              auVar25._4_4_ = fVar61 * auVar13._4_4_;
              auVar25._0_4_ = fVar60 * auVar13._0_4_;
              auVar25._8_4_ = fVar62 * auVar13._8_4_;
              auVar25._12_4_ = fVar63 * auVar13._12_4_;
              auVar25._16_4_ = fVar74 * auVar13._16_4_;
              auVar25._20_4_ = fVar75 * auVar13._20_4_;
              auVar25._24_4_ = fVar76 * auVar13._24_4_;
              auVar25._28_4_ = 0x34000000;
              local_1420._8_4_ = 0x80000000;
              local_1420._0_8_ = 0x8000000080000000;
              local_1420._12_4_ = 0x80000000;
              local_1420._16_4_ = 0x80000000;
              local_1420._20_4_ = 0x80000000;
              local_1420._24_4_ = 0x80000000;
              local_1420._28_4_ = 0x80000000;
              auVar109._0_4_ = fVar127 * auVar56._0_4_;
              auVar109._4_4_ = fVar129 * auVar56._4_4_;
              auVar109._8_4_ = fVar130 * auVar56._8_4_;
              auVar109._12_4_ = fVar131 * auVar56._12_4_;
              auVar109._16_4_ = fVar132 * auVar56._16_4_;
              auVar109._20_4_ = fVar133 * auVar56._20_4_;
              auVar109._24_4_ = fVar134 * auVar56._24_4_;
              auVar109._28_4_ = 0;
              auVar83 = vfmsub213ps_fma(auVar56,local_1060,auVar25);
              auVar45 = vandps_avx(auVar23,auVar51);
              auVar59 = vandps_avx(auVar25,auVar51);
              auVar45 = vcmpps_avx(auVar45,auVar59,1);
              local_12a0 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar77),auVar45);
              auVar124._0_4_ = fVar113 * auVar12._0_4_;
              auVar124._4_4_ = fVar116 * auVar12._4_4_;
              auVar124._8_4_ = fVar118 * auVar12._8_4_;
              auVar124._12_4_ = fVar120 * auVar12._12_4_;
              auVar124._16_4_ = fVar121 * auVar12._16_4_;
              auVar124._20_4_ = fVar122 * auVar12._20_4_;
              auVar124._24_4_ = fVar123 * auVar12._24_4_;
              auVar124._28_4_ = 0;
              auVar77 = vfmsub213ps_fma(auVar12,local_1080,auVar109);
              auVar26._4_4_ = local_1020._4_4_ * fVar61;
              auVar26._0_4_ = local_1020._0_4_ * fVar60;
              auVar26._8_4_ = local_1020._8_4_ * fVar62;
              auVar26._12_4_ = local_1020._12_4_ * fVar63;
              auVar26._16_4_ = local_1020._16_4_ * fVar74;
              auVar26._20_4_ = local_1020._20_4_ * fVar75;
              auVar26._24_4_ = local_1020._24_4_ * fVar76;
              auVar26._28_4_ = auVar59._28_4_;
              auVar83 = vfmsub213ps_fma(local_1000,local_10a0,auVar26);
              auVar45 = vandps_avx(auVar26,auVar51);
              auVar59 = vandps_avx(auVar109,auVar51);
              auVar45 = vcmpps_avx(auVar45,auVar59,1);
              local_1280 = vblendvps_avx(ZEXT1632(auVar77),ZEXT1632(auVar83),auVar45);
              auVar77 = vfmsub213ps_fma(local_1020,local_1060,auVar24);
              auVar83 = vfmsub213ps_fma(auVar13,local_10a0,auVar124);
              auVar45 = vandps_avx(auVar24,auVar51);
              auVar59 = vandps_avx(auVar124,auVar51);
              auVar45 = vcmpps_avx(auVar45,auVar59,1);
              local_1260 = vblendvps_avx(ZEXT1632(auVar83),ZEXT1632(auVar77),auVar45);
              auVar77 = vpackssdw_avx(auVar68._0_16_,auVar68._16_16_);
              fVar63 = local_1260._0_4_;
              fVar74 = local_1260._4_4_;
              auVar13._4_4_ = fVar74 * local_1040;
              auVar13._0_4_ = fVar63 * local_1040;
              fVar75 = local_1260._8_4_;
              auVar13._8_4_ = fVar75 * local_1040;
              fVar76 = local_1260._12_4_;
              auVar13._12_4_ = fVar76 * local_1040;
              fVar93 = local_1260._16_4_;
              auVar13._16_4_ = fVar93 * local_1040;
              fVar94 = local_1260._20_4_;
              auVar13._20_4_ = fVar94 * local_1040;
              fVar95 = local_1260._24_4_;
              auVar13._24_4_ = fVar95 * local_1040;
              auVar13._28_4_ = fVar135;
              auVar83 = vfmadd213ps_fma(local_1500,local_1280,auVar13);
              auVar83 = vfmadd213ps_fma(local_1480,local_12a0,ZEXT1632(auVar83));
              fVar90 = auVar83._0_4_ + auVar83._0_4_;
              fVar60 = auVar83._4_4_ + auVar83._4_4_;
              fVar61 = auVar83._8_4_ + auVar83._8_4_;
              fVar62 = auVar83._12_4_ + auVar83._12_4_;
              auVar59 = ZEXT1632(CONCAT412(fVar62,CONCAT48(fVar61,CONCAT44(fVar60,fVar90))));
              auVar103._0_4_ = fVar63 * auVar78._0_4_;
              auVar103._4_4_ = fVar74 * fVar115;
              auVar103._8_4_ = fVar75 * fVar117;
              auVar103._12_4_ = fVar76 * fVar119;
              auVar103._16_4_ = fVar93 * auVar64._0_4_;
              auVar103._20_4_ = fVar94 * fVar137;
              auVar103._24_4_ = fVar95 * fVar138;
              auVar103._28_4_ = 0;
              auVar83 = vfmadd213ps_fma(local_1400,local_1280,auVar103);
              auVar48 = vfmadd213ps_fma(local_13e0,local_12a0,ZEXT1632(auVar83));
              auVar45 = vrcpps_avx(auVar59);
              auVar125._8_4_ = 0x3f800000;
              auVar125._0_8_ = &DAT_3f8000003f800000;
              auVar125._12_4_ = 0x3f800000;
              auVar125._16_4_ = 0x3f800000;
              auVar125._20_4_ = 0x3f800000;
              auVar125._24_4_ = 0x3f800000;
              auVar125._28_4_ = 0x3f800000;
              auVar83 = vfnmadd213ps_fma(auVar45,auVar59,auVar125);
              auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar45,auVar45);
              local_1500._28_4_ = 0x3f800000;
              local_1500._0_28_ =
                   ZEXT1628(CONCAT412((auVar48._12_4_ + auVar48._12_4_) * auVar83._12_4_,
                                      CONCAT48((auVar48._8_4_ + auVar48._8_4_) * auVar83._8_4_,
                                               CONCAT44((auVar48._4_4_ + auVar48._4_4_) *
                                                        auVar83._4_4_,
                                                        (auVar48._0_4_ + auVar48._0_4_) *
                                                        auVar83._0_4_))));
              uVar40 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar104._4_4_ = uVar40;
              auVar104._0_4_ = uVar40;
              auVar104._8_4_ = uVar40;
              auVar104._12_4_ = uVar40;
              auVar104._16_4_ = uVar40;
              auVar104._20_4_ = uVar40;
              auVar104._24_4_ = uVar40;
              auVar104._28_4_ = uVar40;
              auVar45 = vcmpps_avx(auVar104,local_1500,2);
              auVar78._0_4_ = (ray->super_RayK<1>).tfar;
              auVar110._4_4_ = auVar78._0_4_;
              auVar110._0_4_ = auVar78._0_4_;
              auVar110._8_4_ = auVar78._0_4_;
              auVar110._12_4_ = auVar78._0_4_;
              auVar110._16_4_ = auVar78._0_4_;
              auVar110._20_4_ = auVar78._0_4_;
              auVar110._24_4_ = auVar78._0_4_;
              auVar110._28_4_ = auVar78._0_4_;
              auVar68 = vcmpps_avx(local_1500,auVar110,2);
              auVar45 = vandps_avx(auVar45,auVar68);
              auVar111._0_8_ = CONCAT44(fVar60,fVar90) ^ 0x8000000080000000;
              auVar111._8_4_ = -fVar61;
              auVar111._12_4_ = -fVar62;
              auVar111._16_4_ = 0x80000000;
              auVar111._20_4_ = 0x80000000;
              auVar111._24_4_ = 0x80000000;
              auVar111._28_4_ = 0x80000000;
              auVar68 = vcmpps_avx(auVar111,auVar59,4);
              auVar45 = vandps_avx(auVar45,auVar68);
              auVar83 = vpackssdw_avx(auVar45._0_16_,auVar45._16_16_);
              auVar77 = vpand_avx(auVar83,auVar77);
              local_1240 = vpmovsxwd_avx2(auVar77);
              if ((((((((local_1240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1240 >> 0x7f,0) != '\0') ||
                    (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1240 >> 0xbf,0) != '\0') ||
                  (local_1240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1240[0x1f] < '\0') {
                uStack_12f0 = 0;
                uStack_12ec = 0;
                uStack_12e8 = 0;
                uStack_12e4 = 0;
                uStack_12d0 = 0;
                uStack_12cc = 0;
                uStack_12c8 = 0;
                uStack_12c4 = 0;
                local_11e0 = local_1500;
                local_1160 = local_1120;
                auVar45 = vrcpps_avx(local_12c0);
                local_1460 = local_1240;
                auVar114._8_4_ = 0x3f800000;
                auVar114._0_8_ = &DAT_3f8000003f800000;
                auVar114._12_4_ = 0x3f800000;
                auVar114._16_4_ = 0x3f800000;
                auVar114._20_4_ = 0x3f800000;
                auVar114._24_4_ = 0x3f800000;
                auVar114._28_4_ = 0x3f800000;
                auVar83 = vfnmadd213ps_fma(local_12c0,auVar45,auVar114);
                auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar45,auVar45);
                auVar105._8_4_ = 0x219392ef;
                auVar105._0_8_ = 0x219392ef219392ef;
                auVar105._12_4_ = 0x219392ef;
                auVar105._16_4_ = 0x219392ef;
                auVar105._20_4_ = 0x219392ef;
                auVar105._24_4_ = 0x219392ef;
                auVar105._28_4_ = 0x219392ef;
                auVar45 = vcmpps_avx(local_1100,auVar105,5);
                auVar45 = vandps_avx(auVar45,ZEXT1632(auVar83));
                auVar27._4_4_ = local_1300._4_4_ * auVar45._4_4_;
                auVar27._0_4_ = local_1300._0_4_ * auVar45._0_4_;
                auVar27._8_4_ = local_1300._8_4_ * auVar45._8_4_;
                auVar27._12_4_ = local_1300._12_4_ * auVar45._12_4_;
                auVar27._16_4_ = auVar45._16_4_ * 0.0;
                auVar27._20_4_ = auVar45._20_4_ * 0.0;
                auVar27._24_4_ = auVar45._24_4_ * 0.0;
                auVar27._28_4_ = 0;
                auVar68 = vminps_avx(auVar27,auVar114);
                auVar28._4_4_ = fStack_12dc * auVar45._4_4_;
                auVar28._0_4_ = local_12e0 * auVar45._0_4_;
                auVar28._8_4_ = fStack_12d8 * auVar45._8_4_;
                auVar28._12_4_ = fStack_12d4 * auVar45._12_4_;
                auVar28._16_4_ = auVar45._16_4_ * 0.0;
                auVar28._20_4_ = auVar45._20_4_ * 0.0;
                auVar28._24_4_ = auVar45._24_4_ * 0.0;
                auVar28._28_4_ = 0;
                auVar45 = vminps_avx(auVar28,auVar114);
                auVar59 = vsubps_avx(auVar114,auVar68);
                local_1200 = vblendvps_avx(auVar45,auVar59,local_1120);
                auVar45 = vsubps_avx(auVar114,auVar45);
                local_1220 = vblendvps_avx(auVar68,auVar45,local_1120);
                auVar78._0_4_ = local_1140._0_4_;
                fVar115 = local_1140._4_4_;
                fVar117 = local_1140._8_4_;
                fVar119 = local_1140._12_4_;
                auVar64._0_4_ = local_1140._16_4_;
                fVar137 = local_1140._20_4_;
                fVar138 = local_1140._24_4_;
                local_11c0[0] = local_12a0._0_4_ * auVar78._0_4_;
                local_11c0[1] = local_12a0._4_4_ * fVar115;
                local_11c0[2] = local_12a0._8_4_ * fVar117;
                local_11c0[3] = local_12a0._12_4_ * fVar119;
                fStack_11b0 = local_12a0._16_4_ * auVar64._0_4_;
                fStack_11ac = local_12a0._20_4_ * fVar137;
                fStack_11a8 = local_12a0._24_4_ * fVar138;
                uStack_11a4 = local_1220._28_4_;
                local_11a0[0] = auVar78._0_4_ * local_1280._0_4_;
                local_11a0[1] = fVar115 * local_1280._4_4_;
                local_11a0[2] = fVar117 * local_1280._8_4_;
                local_11a0[3] = fVar119 * local_1280._12_4_;
                fStack_1190 = auVar64._0_4_ * local_1280._16_4_;
                fStack_118c = fVar137 * local_1280._20_4_;
                fStack_1188 = fVar138 * local_1280._24_4_;
                uStack_1184 = auVar45._28_4_;
                local_1180[0] = auVar78._0_4_ * fVar63;
                local_1180[1] = fVar115 * fVar74;
                local_1180[2] = fVar117 * fVar75;
                local_1180[3] = fVar119 * fVar76;
                fStack_1170 = auVar64._0_4_ * fVar93;
                fStack_116c = fVar137 * fVar94;
                fStack_1168 = fVar138 * fVar95;
                uStack_1164 = local_1260._28_4_;
                auVar45 = vpmovzxwd_avx2(auVar77);
                auVar45 = vpslld_avx2(auVar45,0x1f);
                auVar73._8_4_ = 0x7f800000;
                auVar73._0_8_ = 0x7f8000007f800000;
                auVar73._12_4_ = 0x7f800000;
                auVar73._16_4_ = 0x7f800000;
                auVar73._20_4_ = 0x7f800000;
                auVar73._24_4_ = 0x7f800000;
                auVar73._28_4_ = 0x7f800000;
                auVar45 = vblendvps_avx(auVar73,local_1500,auVar45);
                auVar68 = vshufps_avx(auVar45,auVar45,0xb1);
                auVar68 = vminps_avx(auVar45,auVar68);
                auVar59 = vshufpd_avx(auVar68,auVar68,5);
                auVar68 = vminps_avx(auVar68,auVar59);
                auVar59 = vpermpd_avx2(auVar68,0x4e);
                auVar68 = vminps_avx(auVar68,auVar59);
                auVar45 = vcmpps_avx(auVar45,auVar68,0);
                auVar83 = vpackssdw_avx(auVar45._0_16_,auVar45._16_16_);
                auVar77 = vpand_avx(auVar83,auVar77);
                auVar45 = vpmovzxwd_avx2(auVar77);
                auVar45 = vpslld_avx2(auVar45,0x1f);
                if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar45 >> 0x7f,0) == '\0') &&
                      (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar45 >> 0xbf,0) == '\0') &&
                    (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar45[0x1f]) {
                  auVar45 = local_1240;
                }
                uVar31 = vmovmskps_avx(auVar45);
                uVar32 = 0;
                for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                  uVar32 = uVar32 + 1;
                }
                do {
                  uVar41 = (ulong)uVar32;
                  uVar32 = *(uint *)((long)&local_fc0 + uVar41 * 4);
                  pGVar8 = (pSVar37->geometries).items[uVar32].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1460 + uVar41 * 4) = 0;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      auVar78._0_4_ = *(float *)(local_1220 + uVar41 * 4);
                      fVar115 = *(float *)(local_1200 + uVar41 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar41 * 4);
                      (ray->Ng).field_0.field_0.x = local_11c0[uVar41];
                      (ray->Ng).field_0.field_0.y = local_11a0[uVar41];
                      (ray->Ng).field_0.field_0.z = local_1180[uVar41];
                      ray->u = auVar78._0_4_;
                      ray->v = fVar115;
                      ray->primID = *(uint *)((long)&local_1320 + uVar41 * 4);
                      ray->geomID = uVar32;
                      pRVar10 = context->user;
                      ray->instID[0] = pRVar10->instID[0];
                      ray->instPrimID[0] = pRVar10->instPrimID[0];
                      unaff_R12 = local_1538;
                      break;
                    }
                    local_1530.context = context->user;
                    local_14b0 = local_11c0[uVar41];
                    local_14ac = local_11a0[uVar41];
                    local_14a8 = local_1180[uVar41];
                    local_14a4 = *(undefined4 *)(local_1220 + uVar41 * 4);
                    local_14a0 = *(undefined4 *)(local_1200 + uVar41 * 4);
                    local_149c = *(undefined4 *)((long)&local_1320 + uVar41 * 4);
                    local_1498 = uVar32;
                    local_1494 = (local_1530.context)->instID[0];
                    local_1490 = (local_1530.context)->instPrimID[0];
                    local_1480._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_11e0 + uVar41 * 4);
                    local_153c = -1;
                    local_1530.valid = &local_153c;
                    local_1530.geometryUserPtr = pGVar8->userPtr;
                    local_1530.ray = (RTCRayN *)ray;
                    local_1530.hit = (RTCHitN *)&local_14b0;
                    local_1530.N = 1;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019e730f:
                      if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar9->filter)(&local_1530);
                        }
                        if (*local_1530.valid == 0) goto LAB_019e7410;
                      }
                      (((Vec3f *)((long)local_1530.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1530.hit;
                      (((Vec3f *)((long)local_1530.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1530.hit + 4);
                      (((Vec3f *)((long)local_1530.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1530.hit + 8);
                      *(float *)((long)local_1530.ray + 0x3c) = *(float *)(local_1530.hit + 0xc);
                      *(float *)((long)local_1530.ray + 0x40) = *(float *)(local_1530.hit + 0x10);
                      *(float *)((long)local_1530.ray + 0x44) = *(float *)(local_1530.hit + 0x14);
                      *(float *)((long)local_1530.ray + 0x48) = *(float *)(local_1530.hit + 0x18);
                      *(float *)((long)local_1530.ray + 0x4c) = *(float *)(local_1530.hit + 0x1c);
                      *(float *)((long)local_1530.ray + 0x50) = *(float *)(local_1530.hit + 0x20);
                    }
                    else {
                      local_13e0._0_8_ = lVar36;
                      local_1400._0_8_ = pSVar37;
                      (*pGVar8->intersectionFilterN)(&local_1530);
                      lVar36 = local_13e0._0_8_;
                      pSVar37 = (Scene *)local_1400._0_8_;
                      if (*local_1530.valid != 0) goto LAB_019e730f;
LAB_019e7410:
                      (ray->super_RayK<1>).tfar = (float)local_1480._0_4_;
                    }
                    *(undefined4 *)(local_1460 + uVar41 * 4) = 0;
                    auVar78._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar46._4_4_ = auVar78._0_4_;
                    auVar46._0_4_ = auVar78._0_4_;
                    auVar46._8_4_ = auVar78._0_4_;
                    auVar46._12_4_ = auVar78._0_4_;
                    auVar46._16_4_ = auVar78._0_4_;
                    auVar46._20_4_ = auVar78._0_4_;
                    auVar46._24_4_ = auVar78._0_4_;
                    auVar46._28_4_ = auVar78._0_4_;
                    auVar45 = vcmpps_avx(local_1500,auVar46,2);
                    local_1460 = vandps_avx(auVar45,local_1460);
                    unaff_R12 = local_1538;
                  }
                  if ((((((((local_1460 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1460 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1460 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1460 >> 0x7f,0) == '\0') &&
                        (local_1460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1460 >> 0xbf,0) == '\0') &&
                      (local_1460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1460[0x1f]) break;
                  BVHNIntersector1<4,1,true,embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_1530);
                  uVar32 = (uint)local_1530.valid;
                } while( true );
              }
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 != local_14d0);
        }
        auVar78._0_4_ = (ray->super_RayK<1>).tfar;
        auVar47 = ZEXT1664(CONCAT412(auVar78._0_4_,
                                     CONCAT48(auVar78._0_4_,CONCAT44(auVar78._0_4_,auVar78._0_4_))))
        ;
        auVar100 = ZEXT1664(local_1330);
        auVar106 = ZEXT1664(local_1340);
        auVar112 = ZEXT1664(local_1350);
        auVar126 = ZEXT1664(local_1370);
        auVar128 = ZEXT1664(local_1380);
        auVar139 = ZEXT1664(local_13a0);
        auVar141 = ZEXT1664(local_13b0);
        auVar92 = ZEXT1664(local_1430);
        auVar78._0_4_ = local_1360;
        fVar115 = fStack_135c;
        fVar117 = fStack_1358;
        fVar119 = fStack_1354;
        auVar64._0_4_ = local_1390;
        fVar137 = fStack_138c;
        fVar138 = fStack_1388;
        fVar90 = fStack_1384;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }